

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

_Bool ox_stack_increase(stack_s *self,int increase_num)

{
  int iVar1;
  array_s *self_00;
  char *data;
  int index;
  int iVar2;
  
  self_00 = ox_array_new(increase_num + self->element_num,self->element_size);
  if (self_00 != (array_s *)0x0) {
    iVar1 = self->element_num;
    iVar2 = self->num;
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
      index = 0;
    }
    for (; iVar2 != index; index = index + 1) {
      data = ox_array_at(self->array,(self->front + index) % iVar1);
      ox_array_set(self_00,index,data);
    }
    self->front = 0;
    ox_array_delete(self->array);
    self->array = self_00;
    iVar1 = ox_array_num(self_00);
    self->element_num = iVar1;
  }
  return self_00 != (array_s *)0x0;
}

Assistant:

bool 
ox_stack_increase(struct stack_s* self, int increase_num)
{
    struct array_s* tmp = ox_array_new(self->element_num + increase_num, self->element_size);
    if(tmp == NULL)
    {
        return false;
    }

    {
        int i = 0;
        int current_num = self->element_num;
        int current_stack_num = ox_stack_num(self);
        for (; i < current_stack_num; ++i)
        {
            ox_array_set(tmp, i, ox_array_at(self->array, (self->front + i) % current_num));
        }

        self->front = 0;
        ox_array_delete(self->array);
        self->array = tmp;
        self->element_num = ox_array_num(self->array);
    }

    return true;
}